

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O3

void sink(char *targ,char *src)

{
  bool bVar1;
  StripCtrlChars *pSVar2;
  _Bool _Var3;
  int iVar4;
  wchar_t wVar5;
  int iVar6;
  wchar_t wVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  WFile *f;
  time_t tVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  ptrlen str;
  ptrlen str_00;
  ptrlen str_01;
  ptrlen str_02;
  ptrlen str_03;
  ptrlen str_04;
  ptrlen str_05;
  ptrlen str_06;
  scp_sink_action act;
  char transbuf [32768];
  long local_8098;
  uint64_t local_8090;
  scp_sink_action local_8088;
  char *local_8048;
  time_t local_8040;
  char local_8038 [32776];
  
  iVar4 = file_type(targ);
  if ((iVar4 != 2 & targetshouldbedirectory) == 1) {
    bump("%s: Not a directory",targ);
  }
  if (using_sftp == false) {
    (*backend->vt->send)(backend,anon_var_dwarf_3405d + 10,1);
  }
  local_8088.buf = strbuf_new();
  wVar5 = scp_get_sink_action(&local_8088);
  if (local_8088.action == L'\x03' || wVar5 != L'\0') {
LAB_00112907:
    strbuf_free(local_8088.buf);
    return;
  }
  bVar1 = false;
  do {
    if (local_8088.action != L'\x04') {
      if (iVar4 == 2) {
        pcVar10 = stripslashes(local_8088.name,true);
        pcVar8 = local_8088.name;
        pSVar2 = string_scc;
        if (pcVar10 != local_8088.name) {
          sVar9 = strlen(local_8088.name);
          str.len = sVar9;
          str.ptr = pcVar8;
          pcVar8 = stripctrl_string_ptrlen(pSVar2,str);
          pSVar2 = string_scc;
          if (pcVar8 != (char *)0x0) {
            sVar9 = strlen(pcVar10);
            str_00.len = sVar9;
            str_00.ptr = pcVar10;
            pcVar13 = stripctrl_string_ptrlen(pSVar2,str_00);
            if (pcVar13 != (char *)0x0) {
              tell_user(_stderr,"warning: remote host sent a compound pathname \'%s\'",pcVar8);
              tell_user(_stderr,"         renaming local file to \'%s\'",pcVar13);
              safefree(pcVar13);
            }
            safefree(pcVar8);
          }
        }
        sVar9 = strspn(pcVar10,".");
        if (pcVar10[sVar9] == '\0') {
          pcVar8 = "security violation: remote host attempted to write to a \'.\' or \'..\' path!";
LAB_00112e1f:
          bump(pcVar8);
        }
        if (src != (char *)0x0) {
          pcVar8 = stripslashes(src,true);
          iVar6 = strcmp(pcVar10,pcVar8);
          pSVar2 = string_scc;
          if (((iVar6 != 0) && (using_sftp == false)) && (scp_unsafe_mode == '\0')) {
            sVar9 = strlen(pcVar10);
            str_01.len = sVar9;
            str_01.ptr = pcVar10;
            pcVar10 = stripctrl_string_ptrlen(pSVar2,str_01);
            if (pcVar10 != (char *)0x0) {
              tell_user(_stderr,"warning: remote host tried to write to a file called \'%s\'",
                        pcVar10);
              safefree(pcVar10);
            }
            tell_user(_stderr,"         when we requested a file called \'%s\'.",pcVar8);
            tell_user(_stderr,"         If this is a wildcard, consider upgrading to SSH-2 or using"
                     );
            tell_user(_stderr,
                      "         the \'-unsafe\' option. Renaming of this file has been disallowed.")
            ;
            pcVar10 = pcVar8;
          }
        }
        if (*targ == '\0') {
          pcVar8 = dupstr(pcVar10);
        }
        else {
          pcVar8 = dir_file_cat(targ,pcVar10);
        }
      }
      else {
        pcVar8 = dupstr(targ);
      }
      iVar6 = file_type(pcVar8);
      pSVar2 = string_scc;
      if (local_8088.action == L'\x02') {
        if (iVar6 == 0) {
          _Var3 = create_directory(pcVar8);
          pSVar2 = string_scc;
          if (_Var3) goto LAB_00112bbb;
          sVar9 = strlen(pcVar8);
          str_04.len = sVar9;
          str_04.ptr = pcVar8;
          pcVar10 = stripctrl_string_ptrlen(pSVar2,str_04);
          if (pcVar10 != (char *)0x0) {
            pcVar13 = "%s: Cannot create directory";
            goto LAB_00112b9b;
          }
        }
        else if (iVar6 == 2) {
LAB_00112bbb:
          sink(pcVar8,(char *)0x0);
        }
        else {
          sVar9 = strlen(pcVar8);
          str_02.len = sVar9;
          str_02.ptr = pcVar8;
          pcVar10 = stripctrl_string_ptrlen(pSVar2,str_02);
          if (pcVar10 != (char *)0x0) {
            pcVar13 = "%s: Not a directory";
LAB_00112b9b:
            run_err(pcVar13);
            safefree(pcVar10);
          }
        }
      }
      else {
        f = open_new_file(pcVar8,local_8088.permissions);
        pSVar2 = string_scc;
        if (f == (WFile *)0x0) {
          sVar9 = strlen(pcVar8);
          str_03.len = sVar9;
          str_03.ptr = pcVar8;
          pcVar10 = stripctrl_string_ptrlen(pSVar2,str_03);
          if (pcVar10 != (char *)0x0) {
            pcVar13 = "%s: Cannot create file";
            goto LAB_00112b9b;
          }
        }
        else {
          wVar5 = scp_accept_filexfer();
          if (wVar5 != L'\0') {
            safefree(pcVar8);
            close_wfile(f);
            goto LAB_00112907;
          }
          local_8048 = src;
          local_8040 = time((time_t *)0x0);
          pSVar2 = string_scc;
          pcVar10 = stripslashes(pcVar8,true);
          sVar9 = strlen(pcVar10);
          str_05.len = sVar9;
          str_05.ptr = pcVar10;
          pcVar10 = stripctrl_string_ptrlen(pSVar2,str_05);
          if (local_8088.size != 0) {
            local_8098 = 0;
            uVar14 = 0;
            local_8090 = 0;
            do {
              uVar12 = local_8088.size - uVar14;
              if (0x7fff < uVar12) {
                uVar12 = 0x8000;
              }
              wVar5 = scp_recv_filedata(local_8038,(wchar_t)uVar12);
              if (wVar5 < L'\x01') {
                pcVar8 = "Lost connection";
                goto LAB_00112e1f;
              }
              uVar12 = (ulong)(uint)wVar5;
              if (!bVar1) {
                wVar7 = write_to_file(f,local_8038,wVar5);
                if (wVar7 == wVar5) {
                  if ((statistics & 1) == 0) {
                    local_8090 = local_8090 + uVar12;
                    tVar11 = time((time_t *)0x0);
                    if ((local_8098 < tVar11) || (uVar14 + uVar12 == local_8088.size)) {
                      local_8098 = time((time_t *)0x0);
                      print_stats(pcVar10,local_8088.size,local_8090,local_8040,local_8098);
                    }
                  }
                }
                else {
                  bVar1 = true;
                  if ((statistics & 1) == 0) {
                    printf("\r%-25.25s | %50s\n",pcVar10,"Write error.. waiting for end of file");
                  }
                }
              }
              uVar14 = uVar14 + uVar12;
            } while (uVar14 < local_8088.size);
          }
          if (local_8088.settime == true) {
            set_file_times(f,local_8088.mtime,local_8088.atime);
          }
          close_wfile(f);
          src = local_8048;
          pSVar2 = string_scc;
          if (bVar1) {
            sVar9 = strlen(pcVar8);
            str_06.len = sVar9;
            str_06.ptr = pcVar8;
            pcVar10 = stripctrl_string_ptrlen(pSVar2,str_06);
            if (pcVar10 != (char *)0x0) {
              pcVar13 = "%s: Write error";
              goto LAB_00112b9b;
            }
          }
          else {
            scp_finish_filerecv();
            safefree(pcVar10);
          }
        }
      }
      safefree(pcVar8);
    }
    wVar5 = scp_get_sink_action(&local_8088);
    if ((wVar5 != L'\0') || (local_8088.action == L'\x03')) goto LAB_00112907;
  } while( true );
}

Assistant:

static void sink(const char *targ, const char *src)
{
    char *destfname;
    bool targisdir = false;
    bool exists;
    int attr;
    WFile *f;
    uint64_t received;
    bool wrerror = false;
    uint64_t stat_bytes;
    time_t stat_starttime, stat_lasttime;
    char *stat_name;

    attr = file_type(targ);
    if (attr == FILE_TYPE_DIRECTORY)
        targisdir = true;

    if (targetshouldbedirectory && !targisdir)
        bump("%s: Not a directory", targ);

    scp_sink_init();

    struct scp_sink_action act;
    act.buf = strbuf_new();

    while (1) {

        if (scp_get_sink_action(&act))
            goto out;

        if (act.action == SCP_SINK_ENDDIR)
            goto out;

        if (act.action == SCP_SINK_RETRY)
            continue;

        if (targisdir) {
            /*
             * Prevent the remote side from maliciously writing to
             * files outside the target area by sending a filename
             * containing `../'. In fact, it shouldn't be sending
             * filenames with any slashes or colons in at all; so
             * we'll find the last slash, backslash or colon in the
             * filename and use only the part after that. (And
             * warn!)
             *
             * In addition, we also ensure here that if we're
             * copying a single file and the target is a directory
             * (common usage: `pscp host:filename .') the remote
             * can't send us a _different_ file name. We can
             * distinguish this case because `src' will be non-NULL
             * and the last component of that will fail to match
             * (the last component of) the name sent.
             *
             * Well, not always; if `src' is a wildcard, we do
             * expect to get back filenames that don't correspond
             * exactly to it. Ideally in this case, we would like
             * to ensure that the returned filename actually
             * matches the wildcard pattern - but one of SCP's
             * protocol infelicities is that wildcard matching is
             * done at the server end _by the server's rules_ and
             * so in general this is infeasible. Hence, we only
             * accept filenames that don't correspond to `src' if
             * unsafe mode is enabled or we are using SFTP (which
             * resolves remote wildcards on the client side and can
             * be trusted).
             */
            char *striptarget, *stripsrc;

            striptarget = stripslashes(act.name, true);
            if (striptarget != act.name) {
                with_stripctrl(sanname, act.name) {
                    with_stripctrl(santarg, striptarget) {
                        tell_user(stderr, "warning: remote host sent a"
                                  " compound pathname '%s'", sanname);
                        tell_user(stderr, "         renaming local"
                                  " file to '%s'", santarg);
                    }
                }
            }

            /*
             * Also check to see if the target filename is '.' or
             * '..', or indeed '...' and so on because Windows
             * appears to interpret those like '..'.
             */
            if (is_dots(striptarget)) {
                bump("security violation: remote host attempted to write to"
                     " a '.' or '..' path!");
            }

            if (src) {
                stripsrc = stripslashes(src, true);
                if (strcmp(striptarget, stripsrc) &&
                    !using_sftp && !scp_unsafe_mode) {
                    with_stripctrl(san, striptarget)
                        tell_user(stderr, "warning: remote host tried to "
                                  "write to a file called '%s'", san);
                    tell_user(stderr, "         when we requested a file "
                              "called '%s'.", stripsrc);
                    tell_user(stderr, "         If this is a wildcard, "
                              "consider upgrading to SSH-2 or using");
                    tell_user(stderr, "         the '-unsafe' option. Renaming"
                              " of this file has been disallowed.");
                    /* Override the name the server provided with our own. */
                    striptarget = stripsrc;
                }
            }

            if (targ[0] != '\0')
                destfname = dir_file_cat(targ, striptarget);
            else
                destfname = dupstr(striptarget);
        } else {
            /*
             * In this branch of the if, the target area is a
             * single file with an explicitly specified name in any
             * case, so there's no danger.
             */
            destfname = dupstr(targ);
        }
        attr = file_type(destfname);
        exists = (attr != FILE_TYPE_NONEXISTENT);

        if (act.action == SCP_SINK_DIR) {
            if (exists && attr != FILE_TYPE_DIRECTORY) {
                with_stripctrl(san, destfname)
                    run_err("%s: Not a directory", san);
                sfree(destfname);
                continue;
            }
            if (!exists) {
                if (!create_directory(destfname)) {
                    with_stripctrl(san, destfname)
                        run_err("%s: Cannot create directory", san);
                    sfree(destfname);
                    continue;
                }
            }
            sink(destfname, NULL);
            /* can we set the timestamp for directories ? */
            sfree(destfname);
            continue;
        }

        f = open_new_file(destfname, act.permissions);
        if (f == NULL) {
            with_stripctrl(san, destfname)
                run_err("%s: Cannot create file", san);
            sfree(destfname);
            continue;
        }

        if (scp_accept_filexfer()) {
            sfree(destfname);
            close_wfile(f);
            goto out;
        }

        stat_bytes = 0;
        stat_starttime = time(NULL);
        stat_lasttime = 0;
        stat_name = stripctrl_string(
            string_scc, stripslashes(destfname, true));

        received = 0;
        while (received < act.size) {
            char transbuf[32768];
            uint64_t blksize;
            int read;
            blksize = 32768;
            if (blksize > act.size - received)
                blksize = act.size - received;
            read = scp_recv_filedata(transbuf, (int)blksize);
            if (read <= 0)
                bump("Lost connection");
            if (wrerror) {
                received += read;
                continue;
            }
            if (write_to_file(f, transbuf, read) != (int)read) {
                wrerror = true;
                /* FIXME: in sftp we can actually abort the transfer */
                if (statistics)
                    printf("\r%-25.25s | %50s\n",
                           stat_name,
                           "Write error.. waiting for end of file");
                received += read;
                continue;
            }
            if (statistics) {
                stat_bytes += read;
                if (time(NULL) > stat_lasttime ||
                    received + read == act.size) {
                    stat_lasttime = time(NULL);
                    print_stats(stat_name, act.size, stat_bytes,
                                stat_starttime, stat_lasttime);
                }
            }
            received += read;
        }
        if (act.settime) {
            set_file_times(f, act.mtime, act.atime);
        }

        close_wfile(f);
        if (wrerror) {
            with_stripctrl(san, destfname)
                run_err("%s: Write error", san);
            sfree(destfname);
            continue;
        }
        (void) scp_finish_filerecv();
        sfree(stat_name);
        sfree(destfname);
    }
  out:
    strbuf_free(act.buf);
}